

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_Color __thiscall
ON_SurfaceDraftAngleColorMapping::Color
          (ON_SurfaceDraftAngleColorMapping *this,ON_3dVector surface_normal)

{
  bool bVar1;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar2;
  int i;
  double dVar3;
  double dVar4;
  double dVar5;
  
  bVar1 = IsSet(this);
  if (!bVar1) {
    return (ON_Color)ON_Color::UnsetColor.field_0.m_color;
  }
  dVar3 = ON_Interval::operator[](&this->m_angle_range_in_radians,0);
  dVar4 = ON_Interval::operator[](&this->m_angle_range_in_radians,1);
  dVar3 = cos(1.5707963267948966 - dVar3);
  dVar4 = cos(1.5707963267948966 - dVar4);
  dVar5 = ON_3dVector::operator*(&surface_normal,&this->m_up);
  if (ABS(dVar3 - dVar4) <= 1e-08) {
    if ((dVar3 <= dVar5) || (dVar4 <= dVar5)) {
      if ((dVar3 < dVar5) && (dVar4 < dVar5)) goto LAB_005019f1;
      dVar3 = 0.5;
LAB_00501a08:
      dVar3 = ON_Interval::ParameterAt(&this->m_hue_range_in_radians,dVar3);
      goto LAB_00501a10;
    }
LAB_005019d6:
    i = 0;
  }
  else {
    if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
      return (ON_Color)ON_Color::UnsetColor.field_0.m_color;
    }
    dVar3 = (dVar5 - dVar3) / (dVar4 - dVar3);
    if (dVar3 <= 0.0) goto LAB_005019d6;
    if (dVar3 < 1.0) goto LAB_00501a08;
LAB_005019f1:
    i = 1;
  }
  dVar3 = ON_Interval::operator[](&this->m_hue_range_in_radians,i);
LAB_00501a10:
  aVar2 = (anon_union_4_2_6147a14e_for_ON_Color_15)ON_Color::FromHueInRadians(dVar3);
  return (ON_Color)aVar2;
}

Assistant:

const ON_Color ON_SurfaceDraftAngleColorMapping::Color(
  ON_3dVector surface_normal
) const
{
  for (;;)
  {
    if (false == IsSet())
      break;

    const double a0 = ON_HALFPI - this->m_angle_range_in_radians[0];
    const double a1 = ON_HALFPI - this->m_angle_range_in_radians[1];
    const double mn = cos(a0);
    const double mx = cos(a1);

    const double n_dot_up = surface_normal * this->m_up;
    double h;

    if (fabs(mn - mx) <= 1e-8)
    {
      if (n_dot_up < mn && n_dot_up < mx)
        h = this->m_hue_range_in_radians[0];
      else if (n_dot_up > mn && n_dot_up > mx)
        h = this->m_hue_range_in_radians[1];
      else
        h = this->m_hue_range_in_radians.ParameterAt(0.5);
    }
    else if (mn != mx)
    {
      double t = (n_dot_up - mn) / (mx - mn);
      if (t <= 0.0)
        h = this->m_hue_range_in_radians[0];
      else if (t >= 1.0)
        h = this->m_hue_range_in_radians[1];
      else
        h = this->m_hue_range_in_radians.ParameterAt(t);
    }
    else
      break;

    return ON_Color::FromHueInRadians(h);
  }
  return ON_Color::UnsetColor;
}